

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseBlockInstr
          (WastParser *this,unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  Expr *pEVar1;
  char *pcVar2;
  bool bVar3;
  TokenType TVar4;
  Result RVar5;
  Expr *pEVar6;
  Expr *local_80;
  Token local_78;
  Location loc;
  
  GetLocation(&loc,this);
  TVar4 = Peek(this,0);
  if (TVar4 == Try) {
    Consume(&local_78,this);
    ErrorUnlessOpcodeEnabled(this,&local_78);
    MakeUnique<wabt::TryExpr,wabt::Location&>((wabt *)&local_78,&loc);
    RVar5 = ParseLabelOpt(this,(string *)((long)local_78.loc.filename.data_ + 0x40));
    pEVar6 = (Expr *)local_78.loc.filename.data_;
    if ((((RVar5.enum_ == Error) ||
         (RVar5 = ParseBlock(this,(Block *)((long)local_78.loc.filename.data_ + 0x40)),
         pEVar6 = (Expr *)local_78.loc.filename.data_, RVar5.enum_ == Error)) ||
        (RVar5 = Expect(this,Catch), pEVar6 = (Expr *)local_78.loc.filename.data_,
        RVar5.enum_ == Error)) ||
       (RVar5 = ParseEndLabelOpt(this,(string *)((long)local_78.loc.filename.data_ + 0x40)),
       pEVar6 = (Expr *)local_78.loc.filename.data_, RVar5.enum_ == Error)) goto LAB_0023d0ad;
    RVar5 = ParseTerminatingInstrList
                      (this,(ExprList *)&((Expr *)((long)local_78.loc.filename.data_ + 0x100))->loc)
    ;
  }
  else {
    if (TVar4 == If) {
      Consume(&local_78,this);
      MakeUnique<wabt::IfExpr,wabt::Location&>((wabt *)&local_80,&loc);
      RVar5 = ParseLabelOpt(this,(string *)(local_80 + 1));
      pEVar6 = local_80;
      if ((RVar5.enum_ == Error) ||
         (RVar5 = ParseBlock(this,(Block *)(local_80 + 1)), pEVar6 = local_80, RVar5.enum_ == Error)
         ) goto LAB_0023d0ad;
      bVar3 = Match(this,Else);
      if (bVar3) {
        RVar5 = ParseEndLabelOpt(this,(string *)(local_80 + 1));
        pEVar6 = local_80;
        if ((RVar5.enum_ == Error) ||
           (RVar5 = ParseTerminatingInstrList(this,(ExprList *)&local_80[4].loc), pEVar6 = local_80,
           RVar5.enum_ == Error)) goto LAB_0023d0ad;
        GetLocation(&local_78.loc,this);
        local_80[5]._vptr_Expr = (_func_int **)local_78.loc.field_1.field_1.offset;
        local_80[5].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)local_78.loc.field_1._8_8_
        ;
        *(char **)((long)&local_80[4].loc.field_1 + 8) = local_78.loc.filename.data_;
        *(size_type *)&local_80[4].type_ = local_78.loc.filename.size_;
      }
      RVar5 = Expect(this,End);
      pEVar6 = local_80;
      if ((RVar5.enum_ == Error) ||
         (RVar5 = ParseEndLabelOpt(this,(string *)(local_80 + 1)), pEVar6 = local_80,
         RVar5.enum_ == Error)) goto LAB_0023d0ad;
      local_80 = (Expr *)0x0;
      pEVar1 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
               _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
               super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
      (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = pEVar6;
      if (pEVar1 == (Expr *)0x0) {
        return (Result)Ok;
      }
      (*pEVar1->_vptr_Expr[1])();
      pEVar6 = local_80;
      goto LAB_0023d0fd;
    }
    if (TVar4 == Loop) {
      Consume(&local_78,this);
      MakeUnique<wabt::BlockExprBase<(wabt::ExprType)25>,wabt::Location&>((wabt *)&local_78,&loc);
    }
    else {
      if (TVar4 != Block) {
        __assert_fail("!\"ParseBlockInstr should only be called when IsBlockInstr() is true\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/wast-parser.cc"
                      ,0x9bc,"Result wabt::WastParser::ParseBlockInstr(std::unique_ptr<Expr> *)");
      }
      Consume(&local_78,this);
      MakeUnique<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Location&>((wabt *)&local_78,&loc);
    }
    RVar5 = ParseLabelOpt(this,(string *)((long)local_78.loc.filename.data_ + 0x40));
    pEVar6 = (Expr *)local_78.loc.filename.data_;
    if (RVar5.enum_ == Error) goto LAB_0023d0ad;
    RVar5 = ParseBlock(this,(Block *)((long)local_78.loc.filename.data_ + 0x40));
  }
  pEVar6 = (Expr *)local_78.loc.filename.data_;
  if (((RVar5.enum_ == Error) ||
      (RVar5 = Expect(this,End), pEVar6 = (Expr *)local_78.loc.filename.data_, RVar5.enum_ == Error)
      ) || (RVar5 = ParseEndLabelOpt(this,(string *)((long)local_78.loc.filename.data_ + 0x40)),
           pcVar2 = local_78.loc.filename.data_, pEVar6 = (Expr *)local_78.loc.filename.data_,
           RVar5.enum_ == Error)) {
LAB_0023d0ad:
    if (pEVar6 != (Expr *)0x0) {
      (*pEVar6->_vptr_Expr[1])();
    }
    return (Result)Error;
  }
  local_78.loc.filename.data_ = (char *)0x0;
  pEVar6 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t
           .super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
           super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
  (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
  super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)pcVar2;
  if (pEVar6 == (Expr *)0x0) {
    return (Result)Ok;
  }
  (*pEVar6->_vptr_Expr[1])();
  pEVar6 = (Expr *)local_78.loc.filename.data_;
LAB_0023d0fd:
  if (pEVar6 != (Expr *)0x0) {
    (*pEVar6->_vptr_Expr[1])();
  }
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseBlockInstr(std::unique_ptr<Expr>* out_expr) {
  WABT_TRACE(ParseBlockInstr);
  Location loc = GetLocation();

  switch (Peek()) {
    case TokenType::Block: {
      Consume();
      auto expr = MakeUnique<BlockExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Loop: {
      Consume();
      auto expr = MakeUnique<LoopExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::If: {
      Consume();
      auto expr = MakeUnique<IfExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->true_.label));
      CHECK_RESULT(ParseBlock(&expr->true_));
      if (Match(TokenType::Else)) {
        CHECK_RESULT(ParseEndLabelOpt(expr->true_.label));
        CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
        expr->false_end_loc = GetLocation();
      }
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->true_.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Try: {
      ErrorUnlessOpcodeEnabled(Consume());
      auto expr = MakeUnique<TryExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      EXPECT(Catch);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      CHECK_RESULT(ParseTerminatingInstrList(&expr->catch_));
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    default:
      assert(
          !"ParseBlockInstr should only be called when IsBlockInstr() is true");
      return Result::Error;
  }

  return Result::Ok;
}